

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.h
# Opt level: O3

void __thiscall
VectorWriter::VectorWriter<ParamsWrapper<TransactionSerParams,CTransaction_const>>
          (VectorWriter *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *vchDataIn,
          size_t nPosIn,ParamsWrapper<TransactionSerParams,_const_CTransaction> *args)

{
  long in_FS_OFFSET;
  ParamsStream<VectorWriter_&,_TransactionSerParams> local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this->vchData = vchDataIn;
  this->nPos = nPosIn;
  if ((ulong)((long)(vchDataIn->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(vchDataIn->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start) < nPosIn) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(vchDataIn,nPosIn);
  }
  local_28.m_params = args->m_params;
  local_28.m_substream = this;
  SerializeTransaction<ParamsStream<VectorWriter&,TransactionSerParams>,CTransaction>
            (args->m_object,&local_28,local_28.m_params);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

VectorWriter(std::vector<unsigned char>& vchDataIn, size_t nPosIn, Args&&... args) : VectorWriter{vchDataIn, nPosIn}
    {
        ::SerializeMany(*this, std::forward<Args>(args)...);
    }